

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall
Inline::CompletePolymorphicInlining
          (Inline *this,Instr *callInstr,RegOpnd *returnValueOpnd,LabelInstr *doneLabel,
          Instr *dispatchStartLabel,Instr *ldMethodFldInstr,BailOutKind bailoutKind)

{
  undefined2 valueType;
  code *pcVar1;
  bool bVar2;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  BailOutInstrTemplate<IR::Instr> *instr_00;
  StackSym *pSVar3;
  SymOpnd *pSVar4;
  Instr *this_00;
  ByteCodeUsesInstr *this_01;
  Instr *pIVar5;
  IntConstOpnd *newSrc;
  RegOpnd *this_02;
  int iVar6;
  Instr *pIVar7;
  undefined4 *local_38;
  
  branchTarget = IR::LabelInstr::New(Label,callInstr->m_func,true);
  IR::Instr::InsertBefore(callInstr,&branchTarget->super_Instr);
  instr = IR::BranchInstr::New(Br,branchTarget,callInstr->m_func);
  IR::Instr::InsertBefore(dispatchStartLabel,&instr->super_Instr);
  if (ldMethodFldInstr != (Instr *)0x0) {
    IR::Instr::InsertBefore(callInstr,ldMethodFldInstr);
  }
  instr_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (BailOnNotPolymorphicInlinee,bailoutKind,callInstr,callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,&instr_00->super_Instr);
  pSVar3 = IR::Opnd::GetStackSym(callInstr->m_src2);
  pIVar5 = (pSVar3->field_5).m_instrDef;
  if ((pIVar5 != (Instr *)0x0 & pSVar3->field_0x18) == 1) {
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_38 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar2) {
LAB_00502dda:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *local_38 = 0;
    pIVar5 = (pSVar3->field_5).m_instrDef;
  }
  iVar6 = 0;
  do {
    if (pIVar5->m_src2 == (Opnd *)0x0) {
LAB_00502c6b:
      pIVar7 = (Instr *)0x0;
    }
    else {
      bVar2 = IR::Opnd::IsSymOpnd(pIVar5->m_src2);
      if (!bVar2) goto LAB_00502c6b;
      pSVar4 = IR::Opnd::AsSymOpnd(pIVar5->m_src2);
      pSVar3 = Sym::AsStackSym(pSVar4->m_sym);
      bVar2 = StackSym::IsArgSlotSym(pSVar3);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar2) goto LAB_00502dda;
        *local_38 = 0;
      }
      if (((pSVar3->field_0x18 & 1) == 0) || ((pSVar3->field_5).m_instrDef == (Instr *)0x0)) {
        bVar2 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase);
        if (!bVar2) {
          bVar2 = Func::IsInPhase(callInstr->m_func,FGBuildPhase);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_38 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar2) goto LAB_00502dda;
            *local_38 = 0;
          }
        }
      }
      if ((pSVar3->field_0x18 & 1) == 0) goto LAB_00502c6b;
      pIVar7 = (pSVar3->field_5).m_instrDef;
    }
    if (pIVar5->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar5->m_opcode == StartCall) {
        if (pIVar7 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar2) goto LAB_00502dda;
          *local_38 = 0;
        }
        break;
      }
      this_00 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func);
      IR::Instr::SetByteCodeOffset(this_00,callInstr);
      IR::Instr::SetSrc1(this_00,pIVar5->m_src1);
      IR::Instr::InsertBefore(callInstr,this_00);
      iVar6 = iVar6 + 1;
      IR::Instr::Remove(pIVar5);
    }
    pIVar5 = pIVar7;
  } while (pIVar7 != (Instr *)0x0);
  this_01 = IR::ByteCodeUsesInstr::New(callInstr);
  IR::ByteCodeUsesInstr::Set(this_01,callInstr->m_src1);
  IR::Instr::InsertBefore(callInstr,&this_01->super_Instr);
  pIVar5 = IR::Instr::New(EndCallForPolymorphicInlinee,callInstr->m_func);
  newSrc = IR::IntConstOpnd::New((ulong)(iVar6 + 3),TyInt32,callInstr->m_func,true);
  IR::Instr::SetSrc1(pIVar5,&newSrc->super_Opnd);
  if (returnValueOpnd != (RegOpnd *)0x0) {
    pSVar3 = Sym::AsStackSym(&returnValueOpnd->m_sym->super_Sym);
    this_02 = IR::RegOpnd::New(pSVar3,pSVar3->m_type,callInstr->m_func);
    valueType = (returnValueOpnd->super_Opnd).m_valueType;
    IR::Opnd::SetValueType(&this_02->super_Opnd,(ValueType)valueType);
    IR::Instr::SetDst(pIVar5,&this_02->super_Opnd);
  }
  IR::Instr::InsertBefore(callInstr,pIVar5);
  IR::Instr::InsertBefore(callInstr,&doneLabel->super_Instr);
  IR::Instr::Remove(callInstr);
  return;
}

Assistant:

void Inline::CompletePolymorphicInlining(IR::Instr* callInstr, IR::RegOpnd* returnValueOpnd, IR::LabelInstr* doneLabel, IR::Instr* dispatchStartLabel, IR::Instr* ldMethodFldInstr, IR::BailOutKind bailoutKind)
{
    // Label $bailout:
    // LdMethodFldPolyInlineMiss
    // BailOnNotPolymorphicInlinee $callOutBytecodeOffset - BailOutOnFailedPolymorphicInlineTypeCheck
    // ByteCoudeUses
    // BytecodeArgoutUses
    // returnValueOpnd = EndCallForPolymorphicInlinee actualsCount
    IR::LabelInstr* bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, /*helperLabel*/ true);
    callInstr->InsertBefore(bailOutLabel);
    dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::Br, bailOutLabel, callInstr->m_func));

    // Only fixed function inlining requires a ldMethodFldInstr
    if (ldMethodFldInstr)
    {
        callInstr->InsertBefore(ldMethodFldInstr);
    }

    callInstr->InsertBefore(IR::BailOutInstr::New(Js::OpCode::BailOnNotPolymorphicInlinee, bailoutKind, callInstr, callInstr->m_func));

    uint actualsCount = 0;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        IR::Instr* bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func);
        bytecodeArgOutUse->SetByteCodeOffset(callInstr);
        bytecodeArgOutUse->SetSrc1(argInstr->GetSrc1());
        callInstr->InsertBefore(bytecodeArgOutUse);
        actualsCount++;
        // Remove the original args
        argInstr->Remove();
        return false;
    });
    IR::ByteCodeUsesInstr* bytecodeUses = IR::ByteCodeUsesInstr::New(callInstr);
    bytecodeUses->Set(callInstr->GetSrc1());
    callInstr->InsertBefore(bytecodeUses);

    IR::Instr* endCallInstr = IR::Instr::New(Js::OpCode::EndCallForPolymorphicInlinee, callInstr->m_func);
    endCallInstr->SetSrc1(IR::IntConstOpnd::New(actualsCount + Js::Constants::InlineeMetaArgCount, TyInt32, callInstr->m_func, /*dontEncode*/ true));
    if (returnValueOpnd)
    {
        StackSym* returnValueSym = returnValueOpnd->m_sym->AsStackSym();
        IR::Opnd* dstOpnd = IR::RegOpnd::New(returnValueSym, returnValueSym->GetType(), callInstr->m_func);
        dstOpnd->SetValueType(returnValueOpnd->GetValueType());
        endCallInstr->SetDst(dstOpnd);
    }
    callInstr->InsertBefore(endCallInstr);
    callInstr->InsertBefore(doneLabel);
    callInstr->Remove(); // We don't need callInstr anymore.
}